

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall Assimp::IFC::Schema_2x3::IfcSurfaceStyle::~IfcSurfaceStyle(IfcSurfaceStyle *this)

{
  ~IfcSurfaceStyle((IfcSurfaceStyle *)&this[-1].field_0x60);
  return;
}

Assistant:

IfcSurfaceStyle() : Object("IfcSurfaceStyle") {}